

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyboard.c
# Opt level: O1

void keyboard_tick(void)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    *(byte *)((long)key_array + lVar1) = *(byte *)((long)key_array + lVar1) & 0xf9;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x38c);
  unicode_count = 0;
  return;
}

Assistant:

void keyboard_tick(void)
{
   /* clear pressed/released bits */
   int i;
   for (i = 0; i < ALLEGRO_KEY_MAX; i++) {
      key_array[i] &= ~(1 << 1);
      key_array[i] &= ~(1 << 2);
   }
   
   unicode_count = 0;
}